

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O2

bool __thiscall
ON_Mesh::SetTextureCoordinatesEx
          (ON_Mesh *this,ON_TextureMapping *mapping,ON_Xform *mesh_xform,bool bLazy,bool bSeamCheck)

{
  ON_2fPoint OVar1;
  uint uVar2;
  ON_2fPoint *pOVar3;
  double dVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  long lVar8;
  ON_Xform *pOVar9;
  ON_Xform *pOVar10;
  ON_SimpleArray<int> *Tside_00;
  ulong uVar11;
  ulong uVar12;
  byte bVar13;
  double two_pi_tc;
  ON_SimpleArray<int> *Tsd;
  ON_SimpleArray<int> Tside;
  undefined1 local_298 [16];
  double local_288;
  ON_3dPoint local_278;
  ON_TextureMapping mp;
  
  bVar13 = 0;
  bVar5 = ON_TextureMapping::RequiresVertexNormals(mapping);
  if ((bVar5) && (bVar5 = HasVertexNormals(this), !bVar5)) {
    ComputeVertexNormals(this);
  }
  InvalidateTextureCoordinateBoundingBox(this);
  Tside._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_0081add8;
  Tside.m_a = (int *)0x0;
  Tside.m_count = 0;
  Tside.m_capacity = 0;
  Tsd = (ON_SimpleArray<int> *)0x0;
  ON_TextureMapping::ON_TextureMapping(&mp,mapping);
  two_pi_tc = 1.0;
  if (bSeamCheck) {
    bVar5 = SeamCheckHelper(&mp,&two_pi_tc,&Tside,&Tsd);
    if ((bVar5) && (bVar5 = HasSharedVertices(this), bVar5)) {
      pOVar9 = &ON_Xform::IdentityTransformation;
      pOVar10 = &mp.m_uvw;
      for (lVar8 = 0x10; lVar8 != 0; lVar8 = lVar8 + -1) {
        pOVar10->m_xform[0][0] = pOVar9->m_xform[0][0];
        pOVar9 = (ON_Xform *)((long)pOVar9 + ((ulong)bVar13 * -2 + 1) * 8);
        pOVar10 = (ON_Xform *)((long)pOVar10 + (ulong)bVar13 * -0x10 + 8);
      }
      bVar5 = true;
      Tside_00 = Tsd;
    }
    else {
      bVar5 = false;
      Tside_00 = Tsd;
    }
  }
  else {
    bVar5 = false;
    Tside_00 = (ON_SimpleArray<int> *)0x0;
  }
  bVar6 = ON_TextureMapping::GetTextureCoordinates
                    (&mp,this,&(this->m_T).super_ON_SimpleArray<ON_2fPoint>,mesh_xform,bLazy,
                     Tside_00);
  if (Tside_00 != (ON_SimpleArray<int> *)0x0) {
    bVar5 = (bool)(bVar5 & Tside_00->m_count != 0);
  }
  if (bVar6) {
    ON_MappingTag::Set(&this->m_Ttag,mapping);
    if ((((mesh_xform != (ON_Xform *)0x0) && (bVar7 = ON_Xform::IsValid(mesh_xform), bVar7)) &&
        (bVar7 = ON_Xform::IsIdentity(mesh_xform,0.0), !bVar7)) &&
       (bVar7 = ON_Xform::IsZero(mesh_xform), !bVar7)) {
      pOVar9 = mesh_xform;
      pOVar10 = &(this->m_Ttag).m_mesh_xform;
      for (lVar8 = 0x10; lVar8 != 0; lVar8 = lVar8 + -1) {
        pOVar10->m_xform[0][0] = pOVar9->m_xform[0][0];
        pOVar9 = (ON_Xform *)((long)pOVar9 + ((ulong)bVar13 * -2 + 1) * 8);
        pOVar10 = (ON_Xform *)((long)pOVar10 + (ulong)bVar13 * -0x10 + 8);
      }
    }
    if ((bVar5) && (bVar5 = HasTextureCoordinates(this), bVar5 && 0 < (this->m_F).m_count)) {
      if ((Tside_00 == (ON_SimpleArray<int> *)0x0) ||
         (Tside.m_count == (this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count)) {
        if (Tside_00 != (ON_SimpleArray<int> *)0x0) {
          Tside_00 = (ON_SimpleArray<int> *)Tside.m_a;
        }
      }
      else {
        Tside_00 = (ON_SimpleArray<int> *)0x0;
      }
      AdjustMeshPeriodicTextureCoordinatesHelper
                (this,mesh_xform,&((this->m_T).super_ON_SimpleArray<ON_2fPoint>.m_a)->x,2,
                 (int *)Tside_00,two_pi_tc,&mp);
      pOVar9 = &mapping->m_uvw;
      bVar5 = ON_Xform::IsIdentity(pOVar9,0.0);
      if ((!bVar5) && (bVar5 = ON_Xform::IsZero(pOVar9), !bVar5)) {
        pOVar3 = (this->m_T).super_ON_SimpleArray<ON_2fPoint>.m_a;
        uVar2 = (this->m_T).super_ON_SimpleArray<ON_2fPoint>.m_count;
        uVar12 = 0;
        uVar11 = (ulong)uVar2;
        if ((int)uVar2 < 1) {
          uVar11 = uVar12;
        }
        for (; uVar11 != uVar12; uVar12 = uVar12 + 1) {
          OVar1 = pOVar3[uVar12];
          dVar4 = (double)OVar1.y;
          local_298._8_4_ = SUB84(dVar4,0);
          local_298._0_8_ = (double)OVar1.x;
          local_298._12_4_ = (int)((ulong)dVar4 >> 0x20);
          local_288 = 0.0;
          ON_Xform::operator*(&local_278,pOVar9,(ON_3dPoint *)local_298);
          OVar1.y = (float)local_278.y;
          OVar1.x = (float)local_278.x;
          pOVar3[uVar12] = OVar1;
        }
      }
    }
  }
  ON_TextureMapping::~ON_TextureMapping(&mp);
  ON_SimpleArray<int>::~ON_SimpleArray(&Tside);
  return bVar6;
}

Assistant:

bool ON_Mesh::SetTextureCoordinatesEx(
                  const class ON_TextureMapping& mapping,
                  const class ON_Xform* mesh_xform,
                  bool bLazy,
                  bool bSeamCheck
                  )
{
  if ( mapping.RequiresVertexNormals() && !HasVertexNormals() )
    ComputeVertexNormals();

  InvalidateTextureCoordinateBoundingBox();

  ON_SimpleArray<int> Tside;
  ON_SimpleArray<int>* Tsd = 0;
  ON_TextureMapping mp = mapping;

  double two_pi_tc = 1.0;

  if (bSeamCheck)
  {
    bSeamCheck = SeamCheckHelper(mp, two_pi_tc, Tside, Tsd) && HasSharedVertices(*this);
    if (bSeamCheck)
      mp.m_uvw = ON_Xform::IdentityTransformation;
  }

  // Use mp instead of mapping to call GetTextureCoordinates()
  // because m_uvw must be the identity if we have seams.
  bool rc = mp.GetTextureCoordinates(*this,m_T,mesh_xform,bLazy,Tsd);

  if (Tsd != nullptr && Tsd->Count() == 0)
  {
    // Tsd array is needed for seam check but it was not filled by GetTextureCoordinates.
    // This happened because matching texture coordinates were found. These coordinates
    // were already once seam checked. So seam check can be skipped now.
    bSeamCheck = false;
  }

  if (rc)
  {
    // update the texture coordinate tag
    m_Ttag.Set(mapping);
    if (    mesh_xform
         && mesh_xform->IsValid()
         && !mesh_xform->IsIdentity()
         && !mesh_xform->IsZero()
       )
    {
      m_Ttag.m_mesh_xform  = *mesh_xform;
    }
  }

  if ( rc && bSeamCheck && HasTextureCoordinates() && m_F.Count() > 0 )
  {
    float* mesh_T = (float*)m_T.Array();
    int mesh_T_stride = sizeof(m_T[0])/sizeof(mesh_T[0]);
    if ( Tsd && Tside.Count() != m_V.Count() )
      Tsd = 0;
    AdjustMeshPeriodicTextureCoordinatesHelper( *this, mesh_xform, mesh_T, mesh_T_stride, Tsd ? Tside.Array() : 0, two_pi_tc, mp );
    mesh_T = 0; // when the array is grown, the pointer may become invalid
    if ( !mapping.m_uvw.IsIdentity() && !mapping.m_uvw.IsZero() )
    {
      // Apply the uvw transformation that is on mapping
      // to the texture coordinates.
      ON_2fPoint* meshT = m_T.Array();
      ON_3dPoint T;
      int vi, vcnt = m_T.Count();
      for ( vi = 0; vi < vcnt; vi++ )
      {
        T.x = meshT[vi].x;
        T.y = meshT[vi].y;
        T.z = 0.0;
        T = mapping.m_uvw*T;
        meshT[vi].x = (float)T.x;
        meshT[vi].y = (float)T.y;
      }
    }
  }

  return rc;
}